

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O3

void hamming_test(void)

{
  ulong uVar1;
  int iVar2;
  int l;
  ulong uVar3;
  ulong local_40;
  
  _assert_true(1,"roaring_hamming(0xffffffffffffffffULL) == 64",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x15);
  iVar2 = 0x40;
  do {
    _assert_true(1,"roaring_hamming(1ULL << k) == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x17);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  local_40 = 0;
  do {
    uVar3 = 0;
    do {
      uVar1 = 1L << ((byte)local_40 & 0x3f) | 1L << (uVar3 & 0x3f);
      uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
      uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
      _assert_true((ulong)((char)((local_40 != uVar3) + '\x01') ==
                          (char)(((uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                0x38)),"roaring_hamming((1ULL << k) | (1ULL << l)) == 2 - (k == l)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                   ,0x1c);
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x40);
    local_40 = local_40 + 1;
  } while (local_40 != 0x40);
  return;
}

Assistant:

DEFINE_TEST(hamming_test) {
    assert_true(roaring_hamming(0xffffffffffffffffULL) == 64);
    for (int k = 0; k < 64; k++) {
        assert_true(roaring_hamming(1ULL << k) == 1);
    }
    for (int k = 0; k < 64; k++) {
        for (int l = 0; l < 64; l++) {
            assert_true(roaring_hamming((1ULL << k) | (1ULL << l)) ==
                        2 - (k == l));
        }
    }
}